

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  long lVar2;
  ImGuiWindow **ppIVar3;
  long lVar4;
  long lVar5;
  
  pIVar1 = GImGui;
  ppIVar3 = (GImGui->WindowsFocusOrder).Data;
  lVar2 = (long)(GImGui->WindowsFocusOrder).Size;
  if (ppIVar3[lVar2 + -1] != window) {
    lVar2 = lVar2 + -1;
    lVar4 = lVar2;
    if ((int)window->FocusOrder < (int)lVar2) {
      lVar5 = (long)(int)window->FocusOrder;
      lVar4 = (long)(int)lVar2;
      do {
        ppIVar3[lVar5] = ppIVar3[lVar5 + 1];
        ppIVar3 = (pIVar1->WindowsFocusOrder).Data;
        ppIVar3[lVar5]->FocusOrder = ppIVar3[lVar5]->FocusOrder + -1;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    ppIVar3[lVar4] = window;
    window->FocusOrder = (short)lVar2;
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}